

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O0

void __thiscall apngasm_cli::Options::Options(Options *this,int argc,char **argv)

{
  bool bVar1;
  undefined1 local_1c0 [8];
  parsed_options parsed;
  command_line_parser parser;
  _List_const_iterator<boost::program_options::options_description> local_118;
  iterator local_110;
  _List_const_iterator<boost::program_options::options_description> local_108;
  const_iterator it;
  options_description all_opts;
  positional_options_description positional_opts;
  undefined1 local_48 [8];
  OPTGROUPS opts_packer;
  char **argv_local;
  int argc_local;
  Options *this_local;
  
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::vector(&this->option_vec);
  boost::program_options::variables_map::variables_map(&this->vm);
  boost::program_options::options_description::options_description
            (&this->visible_opts,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  this->overwrite_mode = 0;
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::list((list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
          *)local_48);
  boost::program_options::positional_options_description::positional_options_description
            ((positional_options_description *)
             &all_opts.groups.
              super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  processOptions((list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
                  *)local_48,&this->visible_opts,
                 (positional_options_description *)
                 &all_opts.groups.
                  super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  boost::program_options::options_description::options_description
            ((options_description *)&it,
             (uint)boost::program_options::options_description::m_default_line_length,
             (uint)boost::program_options::options_description::m_default_line_length >> 1);
  local_110._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
       ::begin((list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
                *)local_48);
  std::_List_const_iterator<boost::program_options::options_description>::_List_const_iterator
            (&local_108,&local_110);
  while( true ) {
    parser.m_desc =
         (options_description *)
         std::__cxx11::
         list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
         ::end((list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
                *)local_48);
    std::_List_const_iterator<boost::program_options::options_description>::_List_const_iterator
              (&local_118,(iterator *)&parser.m_desc);
    bVar1 = std::operator==(&local_108,&local_118);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::_List_const_iterator<boost::program_options::options_description>::operator*(&local_108);
    boost::program_options::options_description::add((options_description *)&it);
    std::_List_const_iterator<boost::program_options::options_description>::operator++(&local_108);
  }
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&parsed.m_options_prefix,argc,argv);
  boost::program_options::basic_command_line_parser<char>::options
            ((basic_command_line_parser<char> *)&parsed.m_options_prefix,(options_description *)&it)
  ;
  boost::program_options::basic_command_line_parser<char>::positional
            ((basic_command_line_parser<char> *)&parsed.m_options_prefix,
             (positional_options_description *)
             &all_opts.groups.
              super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  boost::program_options::basic_command_line_parser<char>::run
            ((basic_parsed_options<char> *)local_1c0,
             (basic_command_line_parser<char> *)&parsed.m_options_prefix);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::operator=(&this->option_vec,
              (vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
               *)local_1c0);
  boost::program_options::store((basic_parsed_options *)local_1c0,&this->vm,false);
  boost::program_options::notify(&this->vm);
  setOverwriteMode(this);
  boost::program_options::basic_parsed_options<char>::~basic_parsed_options
            ((basic_parsed_options<char> *)local_1c0);
  boost::program_options::basic_command_line_parser<char>::~basic_command_line_parser
            ((basic_command_line_parser<char> *)&parsed.m_options_prefix);
  boost::program_options::options_description::~options_description((options_description *)&it);
  boost::program_options::positional_options_description::~positional_options_description
            ((positional_options_description *)
             &all_opts.groups.
              super__Vector_base<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::
  list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
  ::~list((list<boost::program_options::options_description,_std::allocator<boost::program_options::options_description>_>
           *)local_48);
  return;
}

Assistant:

Options::Options(int argc, char **argv)
    : overwrite_mode(OVERWRITE_INTERACTIVE) {
  namespace po = boost::program_options;

  typedef std::list<po::options_description> OPTGROUPS;
  OPTGROUPS opts_packer;
  po::positional_options_description positional_opts;
  processOptions(opts_packer, visible_opts, positional_opts);

  // pack all options & parse it
  po::options_description all_opts;
  {
    OPTGROUPS::const_iterator it = opts_packer.begin();
    for (; it != opts_packer.end(); ++it) {
      all_opts.add(*it);
    }
  }
  po::command_line_parser parser(argc, argv);
  parser.options(all_opts);
  parser.positional(positional_opts);
  po::parsed_options parsed = parser.run();
  option_vec = parsed.options;
  po::store(parsed, vm);
  po::notify(vm);

  setOverwriteMode();
}